

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QRegion __thiscall QListView::visualRegionForSelection(QListView *this,QItemSelection *selection)

{
  QPersistentModelIndex *this_00;
  undefined4 uVar1;
  QItemSelectionRange *pQVar2;
  long lVar3;
  QPersistentModelIndexData *pQVar4;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *pDVar5
  ;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 *puVar12;
  bool bVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  undefined8 uVar17;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar18;
  long in_RDX;
  undefined8 extraout_RDX;
  int r;
  int iVar19;
  QItemSelectionRange *pQVar20;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  Bucket BVar22;
  QRect local_b8;
  QModelIndex local_a8;
  QRect local_88;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
  uVar1 = *(undefined4 *)&pQVar2[0x59].tl.d;
  *(undefined1 **)
   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
       &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  auVar21._8_8_ = local_78.i;
  auVar21._0_4_ = local_78.r;
  auVar21._4_4_ = local_78.c;
  lVar3 = *(long *)(pQVar2[0x2b].tl.d + 0x20);
  local_88.x2.m_i = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
  local_88.y2.m_i = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
  local_88.x1.m_i = 0;
  local_88.y1.m_i = 0;
  if (*(long *)(in_RDX + 0x10) != 0) {
    this_01 = *(QItemSelectionRange **)(in_RDX + 8);
    pQVar20 = this_01 + *(long *)(in_RDX + 0x10);
    this_00 = &pQVar2[0x3b].br;
    do {
      local_78._0_16_ = auVar21;
      bVar13 = QItemSelectionRange::isValid(this_01);
      auVar21 = (undefined1  [16])local_78._0_16_;
      if (bVar13) {
        local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent();
        cVar14 = comparesEqual(this_00,&local_a8);
        auVar21 = (undefined1  [16])local_78._0_16_;
        if (cVar14 != '\0') {
          iVar15 = QPersistentModelIndex::row();
          iVar16 = QPersistentModelIndex::row();
          if ((*(int *)&pQVar2[0x56].br.d == 1) || (*(char *)&pQVar2[0x54].br.d != '\0')) {
            auVar21 = (undefined1  [16])local_78._0_16_;
            if (iVar15 <= iVar16) {
              do {
                pQVar4 = pQVar2[0x2f].br.d;
                (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar15,uVar1,&local_a8);
                auVar21 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].
                                       super_QArrayData)(selection,&local_58);
                local_78._0_16_ = auVar21;
                cVar14 = QRect::intersects(&local_88);
                if (cVar14 != '\0') {
                  QRegion::operator+=((QRegion *)this,(QRect *)&local_78);
                }
                iVar15 = iVar15 + 1;
                auVar21 = (undefined1  [16])local_78._0_16_;
              } while (iVar16 + 1 != iVar15);
            }
          }
          else {
            iVar19 = iVar15;
            puVar12 = (undefined1 *)local_58._0_8_;
            auVar7 = (undefined1  [16])local_78._0_16_;
            if (iVar15 <= iVar16) {
              while( true ) {
                local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
                pQVar4 = pQVar2[0x2f].br.d;
                QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
                (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar15,0,&local_58);
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
                local_58.m.ptr = local_78.m.ptr;
                local_58.i = local_78.i;
                local_58.r = local_78.r;
                local_58.c = local_78.c;
                pDVar5 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           **)(*(long *)(pQVar2[0x2f].br.d + 8) + 0x90);
                iVar19 = iVar15;
                puVar12 = (undefined1 *)local_78._0_8_;
                if (pDVar5 == (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                               *)0x0) break;
                BVar22 = QHashPrivate::
                         Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                         ::findBucket<QtPrivate::QModelIndexWrapper>
                                   (pDVar5,(QModelIndexWrapper *)&local_58);
                auVar8._8_8_ = local_78.i;
                auVar8._0_4_ = local_78.r;
                auVar8._4_4_ = local_78.c;
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
                puVar12 = (undefined1 *)local_58._0_8_;
                if ((BVar22.span[BVar22.index] == (Span)0xff) ||
                   (auVar7 = auVar8, *(long *)(BVar22.span + 0x80) == 0)) break;
                QPersistentModelIndex::QPersistentModelIndex
                          ((QPersistentModelIndex *)&local_58,&local_78);
                pDVar6 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                         pQVar2[0x58].br.d;
                if (pDVar6 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                              0x0) {
                  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                  auVar7._8_8_ = local_78.i;
                  auVar7._0_4_ = local_78.r;
                  auVar7._4_4_ = local_78.c;
                  puVar12 = (undefined1 *)local_58._0_8_;
                  break;
                }
                pNVar18 = QHashPrivate::
                          Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                          findNode<QPersistentModelIndex>(pDVar6,(QPersistentModelIndex *)&local_58)
                ;
                QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                auVar9._8_8_ = local_78.i;
                auVar9._0_4_ = local_78.r;
                auVar9._4_4_ = local_78.c;
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
                puVar12 = (undefined1 *)local_58._0_8_;
                if ((pNVar18 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) ||
                   (iVar15 = iVar15 + 1, iVar19 = iVar16 + 1, auVar7 = auVar9, iVar16 + 1 == iVar15)
                   ) break;
              }
            }
            local_58._0_8_ = puVar12;
            if (iVar19 <= iVar16) {
              while( true ) {
                local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
                pQVar4 = pQVar2[0x2f].br.d;
                QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
                (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar16,0,&local_58);
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
                local_58.m.ptr = local_78.m.ptr;
                local_58.r = local_78.r;
                local_58.c = local_78.c;
                local_58.i = local_78.i;
                pDVar5 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           **)(*(long *)(pQVar2[0x2f].br.d + 8) + 0x90);
                if (pDVar5 == (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                               *)0x0) break;
                BVar22 = QHashPrivate::
                         Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                         ::findBucket<QtPrivate::QModelIndexWrapper>
                                   (pDVar5,(QModelIndexWrapper *)&local_58);
                auVar11._8_8_ = local_78.i;
                auVar11._0_4_ = local_78.r;
                auVar11._4_4_ = local_78.c;
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
                if ((BVar22.span[BVar22.index] == (Span)0xff) ||
                   (auVar7 = auVar11, *(long *)(BVar22.span + 0x80) == 0)) break;
                QPersistentModelIndex::QPersistentModelIndex
                          ((QPersistentModelIndex *)&local_58,&local_78);
                pDVar6 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                         pQVar2[0x58].br.d;
                if (pDVar6 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                              0x0) {
                  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                  auVar7._8_8_ = local_78.i;
                  auVar7._0_4_ = local_78.r;
                  auVar7._4_4_ = local_78.c;
                  break;
                }
                pNVar18 = QHashPrivate::
                          Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                          findNode<QPersistentModelIndex>(pDVar6,(QPersistentModelIndex *)&local_58)
                ;
                QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                auVar7._8_8_ = local_78.i;
                auVar7._0_4_ = local_78.r;
                auVar7._4_4_ = local_78.c;
                auVar10._8_8_ = local_78.i;
                auVar10._0_4_ = local_78.r;
                auVar10._4_4_ = local_78.c;
                if ((pNVar18 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) ||
                   (iVar15 = iVar16 + -1, bVar13 = iVar16 <= iVar19, iVar16 = iVar15,
                   auVar7 = auVar10, bVar13)) break;
              }
            }
            local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            pQVar4 = pQVar2[0x2f].br.d;
            local_78._0_16_ = auVar7;
            (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar19,uVar1,&local_a8);
            local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            pQVar4 = pQVar2[0x2f].br.d;
            (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar16,uVar1,&local_a8);
            local_b8.x1.m_i = -0x55555556;
            local_b8.y1.m_i = -0x55555556;
            local_b8.x2.m_i = -0x55555556;
            local_b8.y2.m_i = -0x55555556;
            uVar17 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].
                                  super_QArrayData)(selection,&local_58);
            (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                      (selection,&local_78);
            local_b8.x1.m_i = (int)uVar17;
            local_b8.y1.m_i = (int)((ulong)uVar17 >> 0x20);
            local_b8.x2.m_i = (int)extraout_RDX;
            local_b8.y2.m_i = (int)((ulong)extraout_RDX >> 0x20);
            cVar14 = QRect::intersects(&local_88);
            auVar21._8_8_ = local_78.i;
            auVar21._0_4_ = local_78.r;
            auVar21._4_4_ = local_78.c;
            if (cVar14 != '\0') {
              QRegion::operator+=((QRegion *)this,&local_b8);
              auVar21._8_8_ = local_78.i;
              auVar21._0_4_ = local_78.r;
              auVar21._4_4_ = local_78.c;
            }
          }
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pQVar20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    local_78._0_16_ = auVar21;
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QListView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QListView);
    // ### NOTE: this is a potential bottleneck in non-static mode
    int c = d->column;
    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &elem : selection) {
        if (!elem.isValid())
            continue;
        QModelIndex parent = elem.topLeft().parent();
        //we only display the children of the root in a listview
        //we're not interested in the other model indexes
        if (parent != d->root)
            continue;
        int t = elem.topLeft().row();
        int b = elem.bottomRight().row();
        if (d->viewMode == IconMode || d->isWrapping()) { // in non-static mode, we have to go through all selected items
            for (int r = t; r <= b; ++r) {
                const QRect &rect = visualRect(d->model->index(r, c, parent));
                if (viewportRect.intersects(rect))
                    selectionRegion += rect;
            }
        } else { // in static mode, we can optimize a bit
            while (t <= b && d->isHidden(t)) ++t;
            while (b >= t && d->isHidden(b)) --b;
            const QModelIndex top = d->model->index(t, c, parent);
            const QModelIndex bottom = d->model->index(b, c, parent);
            QRect rect(visualRect(top).topLeft(),
                       visualRect(bottom).bottomRight());
            if (viewportRect.intersects(rect))
                selectionRegion += rect;
        }
    }

    return selectionRegion;
}